

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerApp::SyncNetworkData
          (Error *__return_storage_ptr__,CommissionerApp *this)

{
  ErrorCode EVar1;
  element_type *peVar2;
  int iVar3;
  Error *pEVar4;
  CommissionerDataset commDataset;
  BbrDataset bbrDataset;
  ActiveOperationalDataset activeDataset;
  PendingOperationalDataset pendingDataset;
  undefined1 local_2c0 [40];
  CommissionerDataset local_298;
  BbrDataset local_240;
  ActiveOperationalDataset local_1d8;
  PendingOperationalDataset local_100;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  ActiveOperationalDataset::ActiveOperationalDataset(&local_1d8);
  PendingOperationalDataset::PendingOperationalDataset(&local_100);
  local_240.mTriHostname._M_dataplus._M_p = (pointer)&local_240.mTriHostname.field_2;
  local_240.mTriHostname._M_string_length = 0;
  local_240.mTriHostname.field_2._M_local_buf[0] = '\0';
  local_240.mRegistrarHostname._M_dataplus._M_p = (pointer)&local_240.mRegistrarHostname.field_2;
  local_240.mRegistrarHostname._M_string_length = 0;
  local_240.mRegistrarHostname.field_2._M_local_buf[0] = '\0';
  local_240.mRegistrarIpv6Addr._M_dataplus._M_p = (pointer)&local_240.mRegistrarIpv6Addr.field_2;
  local_240.mRegistrarIpv6Addr._M_string_length = 0;
  local_240.mRegistrarIpv6Addr.field_2._M_local_buf[0] = '\0';
  local_240.mPresentFlags = 0;
  local_298.mBorderAgentLocator = 0;
  local_298.mSessionId = 0;
  local_298.mSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.mSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.mSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.mAeSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.mAeSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.mAeSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.mJoinerUdpPort = 0;
  local_298.mAeUdpPort = 0;
  local_298.mNmkpUdpPort = 0;
  local_298.mPresentFlags = 0;
  peVar2 = (this->mCommissioner).
           super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar2->_vptr_Commissioner[0x1a])(local_2c0,peVar2,&local_1d8,0xffff);
  pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_2c0);
  EVar1 = pEVar4->mCode;
  std::__cxx11::string::~string((string *)(local_2c0 + 8));
  if (EVar1 == kNone) {
    peVar2 = (this->mCommissioner).
             super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_Commissioner[0x20])(local_2c0,peVar2,&local_100,0xffff);
    pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_2c0);
    EVar1 = pEVar4->mCode;
    std::__cxx11::string::~string((string *)(local_2c0 + 8));
    if (EVar1 == kNone) {
      peVar2 = (this->mCommissioner).
               super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      (*peVar2->_vptr_Commissioner[0x14])(local_2c0,peVar2,&this->mCommDataset);
      pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_2c0);
      EVar1 = pEVar4->mCode;
      std::__cxx11::string::~string((string *)(local_2c0 + 8));
      if (EVar1 == kNone) {
        peVar2 = (this->mCommissioner).
                 super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        (*peVar2->_vptr_Commissioner[0x12])(local_2c0,peVar2,&local_298,0xffff);
        pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_2c0);
        EVar1 = pEVar4->mCode;
        std::__cxx11::string::~string((string *)(local_2c0 + 8));
        if (EVar1 == kNone) {
          MergeDataset(&this->mCommDataset,&local_298);
          iVar3 = (*((this->mCommissioner).
                     super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_vptr_Commissioner[10])();
          if ((char)iVar3 != '\0') {
            peVar2 = (this->mCommissioner).
                     super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            (*peVar2->_vptr_Commissioner[0x18])(local_2c0,peVar2,&local_240,0xffff);
            pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_2c0);
            EVar1 = pEVar4->mCode;
            std::__cxx11::string::~string((string *)(local_2c0 + 8));
            if (EVar1 != kNone) goto LAB_00186002;
            BbrDataset::operator=(&this->mBbrDataset,&local_240);
          }
          ActiveOperationalDataset::operator=(&this->mActiveDataset,&local_1d8);
          PendingOperationalDataset::operator=(&this->mPendingDataset,&local_100);
        }
      }
    }
  }
LAB_00186002:
  CommissionerDataset::~CommissionerDataset(&local_298);
  BbrDataset::~BbrDataset(&local_240);
  ActiveOperationalDataset::~ActiveOperationalDataset(&local_100.super_ActiveOperationalDataset);
  ActiveOperationalDataset::~ActiveOperationalDataset(&local_1d8);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SyncNetworkData(void)
{
    Error                     error;
    ActiveOperationalDataset  activeDataset;
    PendingOperationalDataset pendingDataset;
    BbrDataset                bbrDataset;
    CommissionerDataset       commDataset;

    SuccessOrExit(error = mCommissioner->GetActiveDataset(activeDataset, 0xFFFF));
    SuccessOrExit(error = mCommissioner->GetPendingDataset(pendingDataset, 0xFFFF));
    SuccessOrExit(error = mCommissioner->SetCommissionerDataset(mCommDataset));
    SuccessOrExit(error = mCommissioner->GetCommissionerDataset(commDataset, 0xFFFF));
    MergeDataset(mCommDataset, commDataset);

    if (IsCcmMode())
    {
        SuccessOrExit(error = mCommissioner->GetBbrDataset(bbrDataset, 0xFFFF));
        mBbrDataset = bbrDataset;
    }
    mActiveDataset  = activeDataset;
    mPendingDataset = pendingDataset;

exit:
    return error;
}